

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O0

shared_ptr<celero::Benchmark> __thiscall celero::TestVector::operator[](TestVector *this,size_t x)

{
  Impl *pIVar1;
  reference pvVar2;
  mutex_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<celero::Benchmark> sVar3;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> mutexLock;
  size_t x_local;
  TestVector *this_local;
  
  mutexLock._M_device = in_RDX;
  pIVar1 = Pimpl<celero::TestVector::Impl>::operator->((Pimpl<celero::TestVector::Impl> *)x);
  std::lock_guard<std::mutex>::lock_guard(&local_28,&pIVar1->testVectorMutex);
  pIVar1 = Pimpl<celero::TestVector::Impl>::operator->((Pimpl<celero::TestVector::Impl> *)x);
  pvVar2 = std::
           vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>
           ::operator[](&pIVar1->testVector,(size_type)mutexLock._M_device);
  std::shared_ptr<celero::Benchmark>::shared_ptr((shared_ptr<celero::Benchmark> *)this,pvVar2);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  sVar3.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Benchmark>)
         sVar3.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Benchmark> TestVector::operator[](size_t x)
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);
	return this->pimpl->testVector[x];
}